

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  AssertionFailure *this_00;
  BinaryReader<mp::internal::IdentityConverter> *pBVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
LAB_001c2e4e:
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 != NOT) {
      if (KVar1 != FIRST_BINARY_LOGICAL) {
        if (KVar1 == FIRST_RELATIONAL) {
          pBVar5 = this->reader_;
          pcVar2 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
          ReadNumericExpr(this,*pcVar2,false);
          pBVar5 = this->reader_;
          pcVar2 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
          ReadNumericExpr(this,*pcVar2,false);
          return (LogicalExpr)NULL_ID;
        }
        goto switchD_001c2cf9_caseD_3c;
      }
      goto LAB_001c2df6;
    }
LAB_001c2dfe:
    ReadLogicalExpr(this);
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar5 = this->reader_;
      pcVar2 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      ReadNumericExpr(this,*pcVar2,false);
      pBVar5 = this->reader_;
      pcVar2 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
      (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
      if (*pcVar2 == 'o') {
        uVar3 = ReadOpCode(this);
        if (0x52 < uVar3) {
          this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
          AssertionFailure::AssertionFailure(this_00,"invalid opcode");
          goto LAB_001c2e4e;
        }
        if (OpCodeInfo::INFO[uVar3].kind == COUNT) {
          ReadCountExpr(this);
          return (LogicalExpr)NULL_ID;
        }
        pBVar5 = this->reader_;
      }
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      local_28.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError(&pBVar5->super_BinaryReaderBase,(CStringRef)0x261792,&local_28);
    default:
switchD_001c2cf9_caseD_3c:
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x2631f2,&local_28);
    case IMPLICATION:
      ReadLogicalExpr(this);
LAB_001c2df6:
      ReadLogicalExpr(this);
      goto LAB_001c2dfe;
    case EXISTS:
      iVar4 = ReadNumArgs(this,3);
      if (0 < iVar4) {
        do {
          ReadLogicalExpr(this);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      break;
    case ALLDIFF:
      iVar4 = ReadNumArgs(this,1);
      if (0 < iVar4) {
        do {
          pBVar5 = this->reader_;
          pcVar2 = (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
          (pBVar5->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
          ReadNumericExpr(this,*pcVar2,false);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
    }
  }
  return (LogicalExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }